

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O0

void send_failure_info(char *msg)

{
  FILE *fdes;
  undefined1 local_18 [8];
  FailMsg fmsg;
  char *msg_local;
  
  fmsg.msg = msg;
  local_18 = (undefined1  [8])strdup(msg);
  fdes = get_pipe();
  ppack(fdes,CK_MSG_FAIL,(CheckMsg *)local_18);
  free((void *)local_18);
  return;
}

Assistant:

void send_failure_info(const char *msg)
{
    FailMsg fmsg;

    fmsg.msg = strdup(msg);
    ppack(get_pipe(), CK_MSG_FAIL, (CheckMsg *) & fmsg);
    free(fmsg.msg);
}